

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

NumberParsingStatus __thiscall
QTextStreamPrivate::getNumber(QTextStreamPrivate *this,qulonglong *ret)

{
  QChar ch_00;
  QChar ch_01;
  QChar ch_02;
  QChar ch_03;
  QChar ch_04;
  QChar ch_05;
  QChar ch_06;
  QChar ch_07;
  QChar ch_08;
  QChar ch_09;
  QChar ch_10;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char16_t *pcVar5;
  long *in_RSI;
  QChar *pQVar6;
  long in_RDI;
  long in_FS_OFFSET;
  int h;
  qsizetype ndigits_3;
  qlonglong ival;
  qsizetype ndigits_2;
  char16_t n_1;
  qsizetype ndigits_1;
  char16_t n;
  qsizetype ndigits;
  qulonglong val;
  int base;
  QChar dig_2;
  QChar pf2_1;
  QChar pf1_1;
  QChar ch_1;
  QChar sign;
  QChar dig_1;
  QChar pf;
  QChar dig;
  QChar pf2;
  QChar pf1;
  QChar ch2;
  QChar ch;
  QString *in_stack_fffffffffffffe48;
  QTextStreamPrivate *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5c;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffe5d;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffe5e;
  byte in_stack_fffffffffffffe5f;
  QTextStreamPrivate *in_stack_fffffffffffffe60;
  byte local_196;
  bool local_194;
  bool local_193;
  bool local_192;
  bool local_191;
  bool local_181;
  long local_170;
  long local_168;
  undefined8 in_stack_fffffffffffffea8;
  long lVar9;
  undefined6 in_stack_fffffffffffffeb0;
  undefined2 in_stack_fffffffffffffeb6;
  char16_t cVar10;
  qsizetype *in_stack_fffffffffffffeb8;
  undefined6 in_stack_fffffffffffffec0;
  undefined2 in_stack_fffffffffffffec6;
  QTextStreamPrivate *in_stack_fffffffffffffec8;
  long local_130;
  int local_114;
  NumberParsingStatus local_fc;
  QChar local_f4;
  char16_t local_f2;
  QChar local_f0;
  QChar local_ee;
  QChar local_ec;
  QChar local_ea [16];
  char16_t local_ca;
  undefined1 local_b0 [12];
  QChar local_a4;
  char16_t local_a2;
  QChar local_6e;
  char16_t local_6c;
  char16_t local_6a;
  QChar local_68;
  QChar local_66;
  QChar local_64;
  QChar local_62;
  char16_t local_60;
  char16_t local_5e;
  char16_t local_5c;
  QChar local_5a;
  QChar local_58;
  char16_t local_56;
  QChar local_54;
  QChar local_52;
  QChar local_50;
  QChar local_4e;
  char16_t local_4c;
  char16_t local_4a;
  char16_t local_16;
  QChar local_14;
  QChar local_12;
  char16_t local_10;
  QChar local_e;
  QChar local_c;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  scan(in_stack_fffffffffffffec8,
       (QChar **)CONCAT26(in_stack_fffffffffffffec6,in_stack_fffffffffffffec0),
       in_stack_fffffffffffffeb8,CONCAT26(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0),
       (TokenDelimiter)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  consumeLastToken(in_stack_fffffffffffffe50);
  local_114 = *(int *)(in_RDI + 300);
  if (local_114 == 0) {
    local_a.ucs = L'ꪪ';
    QChar::QChar(&local_a);
    bVar1 = getChar(in_stack_fffffffffffffe60,
                    (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        CONCAT14(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58)))));
    if (!bVar1) {
      local_fc = npsInvalidPrefix;
      goto LAB_004a9b11;
    }
    QChar::QChar<char16_t,_true>(&local_c,L'0');
    bVar1 = ::operator==((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48);
    if (bVar1) {
      local_e.ucs = L'ꪪ';
      QChar::QChar(&local_e);
      bVar1 = getChar(in_stack_fffffffffffffe60,
                      (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                        CONCAT16(in_stack_fffffffffffffe5e,
                                                 CONCAT15(in_stack_fffffffffffffe5d,
                                                          CONCAT14(in_stack_fffffffffffffe5c,
                                                                   in_stack_fffffffffffffe58)))));
      if (!bVar1) {
        *in_RSI = 0;
        local_fc = npsOk;
        goto LAB_004a9b11;
      }
      local_10 = (char16_t)QChar::toLower((QChar *)in_stack_fffffffffffffe50);
      local_e = (QChar)local_10;
      QChar::QChar<char16_t,_true>(&local_12,L'x');
      bVar1 = ::operator==((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48);
      if (bVar1) {
        local_114 = 0x10;
      }
      else {
        QChar::QChar<char16_t,_true>(&local_14,L'b');
        bVar1 = ::operator==((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48);
        if (bVar1) {
          local_114 = 2;
        }
        else {
          bVar1 = QChar::isDigit((QChar *)0x4a8f14);
          if (((bVar1) && (iVar4 = QChar::digitValue((QChar *)0x4a8f27), -1 < iVar4)) &&
             (iVar4 = QChar::digitValue((QChar *)0x4a8f39), iVar4 < 8)) {
            local_114 = 8;
          }
          else {
            local_114 = 10;
          }
        }
      }
      local_16 = local_e.ucs;
      ch_00.ucs._1_1_ = in_stack_fffffffffffffe5f;
      ch_00.ucs._0_1_ = in_stack_fffffffffffffe5e;
      ungetChar(in_stack_fffffffffffffe50,ch_00);
    }
    else {
      QLocale::negativeSign
                ((QLocale *)
                 CONCAT17(in_stack_fffffffffffffe5f,
                          CONCAT16(in_stack_fffffffffffffe5e,
                                   CONCAT15(in_stack_fffffffffffffe5d,
                                            CONCAT14(in_stack_fffffffffffffe5c,
                                                     in_stack_fffffffffffffe58)))));
      bVar2 = ::operator==((QChar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      bVar1 = false;
      local_181 = true;
      if (!bVar2) {
        QLocale::positiveSign
                  ((QLocale *)
                   CONCAT17(in_stack_fffffffffffffe5f,
                            CONCAT16(in_stack_fffffffffffffe5e,
                                     CONCAT15(in_stack_fffffffffffffe5d,
                                              CONCAT14(in_stack_fffffffffffffe5c,
                                                       in_stack_fffffffffffffe58)))));
        bVar1 = true;
        bVar2 = ::operator==((QChar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        local_181 = true;
        if (!bVar2) {
          local_181 = QChar::isDigit((QChar *)0x4a9016);
        }
      }
      if (bVar1) {
        QString::~QString((QString *)0x4a903b);
      }
      QString::~QString((QString *)0x4a9048);
      if (local_181 == false) {
        local_4a = local_a.ucs;
        ch_01.ucs._1_1_ = in_stack_fffffffffffffe5f;
        ch_01.ucs._0_1_ = in_stack_fffffffffffffe5e;
        ungetChar(in_stack_fffffffffffffe50,ch_01);
        local_fc = npsInvalidPrefix;
        goto LAB_004a9b11;
      }
      local_114 = 10;
    }
    local_4c = local_a.ucs;
    ch_02.ucs._1_1_ = in_stack_fffffffffffffe5f;
    ch_02.ucs._0_1_ = in_stack_fffffffffffffe5e;
    ungetChar(in_stack_fffffffffffffe50,ch_02);
  }
  local_130 = 0;
  switch(local_114) {
  case 2:
    local_4e.ucs = L'ꪪ';
    QChar::QChar(&local_4e);
    local_50.ucs = L'ꪪ';
    QChar::QChar(&local_50);
    local_52.ucs = L'ꪪ';
    QChar::QChar(&local_52);
    bVar1 = getChar(in_stack_fffffffffffffe60,
                    (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        CONCAT14(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58)))));
    local_191 = true;
    if (bVar1) {
      QChar::QChar<char16_t,_true>(&local_54,L'0');
      local_191 = ::operator!=((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48
                              );
    }
    if (local_191 != false) {
      local_fc = npsInvalidPrefix;
      goto LAB_004a9b11;
    }
    bVar1 = getChar(in_stack_fffffffffffffe60,
                    (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        CONCAT14(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58)))));
    local_192 = true;
    if (bVar1) {
      local_56 = (char16_t)QChar::toLower((QChar *)in_stack_fffffffffffffe50);
      QChar::QChar<char16_t,_true>(&local_58,L'b');
      local_192 = ::operator!=((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48
                              );
    }
    if (local_192 != false) {
      local_fc = npsInvalidPrefix;
      goto LAB_004a9b11;
    }
    lVar9 = 0;
    while (bVar1 = getChar(in_stack_fffffffffffffe60,
                           (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                             CONCAT16(in_stack_fffffffffffffe5e,
                                                      CONCAT15(in_stack_fffffffffffffe5d,
                                                               CONCAT14(in_stack_fffffffffffffe5c,
                                                                        in_stack_fffffffffffffe58)))
                                            )), bVar1) {
      local_5a = QChar::toLower((QChar *)in_stack_fffffffffffffe50);
      pcVar5 = QChar::unicode(&local_5a);
      cVar10 = *pcVar5;
      if ((cVar10 != L'0') && (cVar10 != L'1')) {
        local_5c = local_52.ucs;
        ch_03.ucs._1_1_ = in_stack_fffffffffffffe5f;
        ch_03.ucs._0_1_ = in_stack_fffffffffffffe5e;
        ungetChar(in_stack_fffffffffffffe50,ch_03);
        break;
      }
      local_130 = (long)(int)((ushort)cVar10 - 0x30) + local_130 * 2;
      lVar9 = lVar9 + 1;
    }
    if (lVar9 == 0) {
      local_5e = local_50.ucs;
      ch_04.ucs._1_1_ = in_stack_fffffffffffffe5f;
      ch_04.ucs._0_1_ = in_stack_fffffffffffffe5e;
      ungetChar(in_stack_fffffffffffffe50,ch_04);
      local_60 = local_4e.ucs;
      ch_05.ucs._1_1_ = in_stack_fffffffffffffe5f;
      ch_05.ucs._0_1_ = in_stack_fffffffffffffe5e;
      ungetChar(in_stack_fffffffffffffe50,ch_05);
      local_fc = npsMissingDigit;
      goto LAB_004a9b11;
    }
    break;
  default:
    local_fc = npsInvalidPrefix;
    goto LAB_004a9b11;
  case 8:
    local_62.ucs = L'ꪪ';
    QChar::QChar(&local_62);
    local_64.ucs = L'ꪪ';
    QChar::QChar(&local_64);
    bVar1 = getChar(in_stack_fffffffffffffe60,
                    (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        CONCAT14(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58)))));
    local_193 = true;
    if (bVar1) {
      QChar::QChar<char16_t,_true>(&local_66,L'0');
      local_193 = ::operator!=((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48
                              );
    }
    if (local_193 != false) {
      local_fc = npsInvalidPrefix;
      goto LAB_004a9b11;
    }
    lVar9 = 0;
    while (bVar1 = getChar(in_stack_fffffffffffffe60,
                           (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                             CONCAT16(in_stack_fffffffffffffe5e,
                                                      CONCAT15(in_stack_fffffffffffffe5d,
                                                               CONCAT14(in_stack_fffffffffffffe5c,
                                                                        in_stack_fffffffffffffe58)))
                                            )), bVar1) {
      local_68 = QChar::toLower((QChar *)in_stack_fffffffffffffe50);
      pcVar5 = QChar::unicode(&local_68);
      cVar10 = *pcVar5;
      bVar1 = QtMiscUtils::isOctalDigit((uint)(ushort)cVar10);
      if (!bVar1) {
        local_6a = local_64.ucs;
        ch_06.ucs._1_1_ = in_stack_fffffffffffffe5f;
        ch_06.ucs._0_1_ = in_stack_fffffffffffffe5e;
        ungetChar(in_stack_fffffffffffffe50,ch_06);
        break;
      }
      local_130 = (long)(int)((ushort)cVar10 - 0x30) + local_130 * 8;
      lVar9 = lVar9 + 1;
    }
    if (lVar9 == 0) {
      local_6c = local_62.ucs;
      ch_07.ucs._1_1_ = in_stack_fffffffffffffe5f;
      ch_07.ucs._0_1_ = in_stack_fffffffffffffe5e;
      ungetChar(in_stack_fffffffffffffe50,ch_07);
      local_fc = npsMissingDigit;
      goto LAB_004a9b11;
    }
    break;
  case 10:
    local_6e.ucs = L'ꪪ';
    QChar::QChar(&local_6e);
    lVar9 = 0;
    bVar1 = getChar(in_stack_fffffffffffffe60,
                    (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        CONCAT14(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58)))));
    if (!bVar1) {
      local_fc = npsMissingDigit;
      goto LAB_004a9b11;
    }
    QLocale::negativeSign
              ((QLocale *)
               CONCAT17(in_stack_fffffffffffffe5f,
                        CONCAT16(in_stack_fffffffffffffe5e,
                                 CONCAT15(in_stack_fffffffffffffe5d,
                                          CONCAT14(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58)))));
    bVar1 = ::operator!=((QChar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    local_194 = false;
    if (bVar1) {
      QLocale::positiveSign
                ((QLocale *)
                 CONCAT17(in_stack_fffffffffffffe5f,
                          CONCAT16(in_stack_fffffffffffffe5e,
                                   CONCAT15(in_stack_fffffffffffffe5d,
                                            CONCAT14(in_stack_fffffffffffffe5c,
                                                     in_stack_fffffffffffffe58)))));
      local_194 = ::operator!=((QChar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      QString::~QString((QString *)0x4a960b);
    }
    QString::~QString((QString *)0x4a9618);
    if (local_194 != false) {
      bVar1 = QChar::isDigit((QChar *)0x4a9632);
      if (!bVar1) {
        local_a2 = local_6e.ucs;
        ch_08.ucs._1_1_ = in_stack_fffffffffffffe5f;
        ch_08.ucs._0_1_ = in_stack_fffffffffffffe5e;
        ungetChar(in_stack_fffffffffffffe50,ch_08);
        local_fc = npsMissingDigit;
        goto LAB_004a9b11;
      }
      iVar4 = QChar::digitValue((QChar *)0x4a969f);
      local_130 = (long)iVar4;
      lVar9 = lVar9 + 1;
    }
    local_a4.ucs = L'ꪪ';
    QChar::QChar(&local_a4);
    do {
      while( true ) {
        pQVar6 = &local_a4;
        bVar1 = getChar(in_stack_fffffffffffffe60,
                        (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                          CONCAT16(in_stack_fffffffffffffe5e,
                                                   CONCAT15(in_stack_fffffffffffffe5d,
                                                            CONCAT14(in_stack_fffffffffffffe5c,
                                                                     in_stack_fffffffffffffe58)))));
        if (!bVar1) goto LAB_004a9855;
        bVar1 = QChar::isDigit((QChar *)0x4a9703);
        if (!bVar1) break;
        iVar4 = QChar::digitValue((QChar *)0x4a9727);
        local_130 = (long)iVar4 + local_130 * 10;
        lVar9 = lVar9 + 1;
      }
      in_stack_fffffffffffffe60 = (QTextStreamPrivate *)(in_RDI + 0x148);
      QLocale::c(local_b0,pQVar6);
      bVar1 = ::operator!=((QLocale *)in_stack_fffffffffffffe50,(QLocale *)in_stack_fffffffffffffe48
                          );
      local_196 = 0;
      if (bVar1) {
        QLocale::groupSeparator
                  ((QLocale *)
                   CONCAT17(in_stack_fffffffffffffe5f,
                            CONCAT16(in_stack_fffffffffffffe5e,
                                     CONCAT15(in_stack_fffffffffffffe5d,
                                              CONCAT14(in_stack_fffffffffffffe5c,
                                                       in_stack_fffffffffffffe58)))));
        local_196 = ::operator==((QChar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
        QString::~QString((QString *)0x4a97d8);
      }
      in_stack_fffffffffffffe5f = local_196;
      QLocale::~QLocale((QLocale *)0x4a97e5);
    } while ((in_stack_fffffffffffffe5f & 1) != 0);
    local_ca = local_a4.ucs;
    ch_09.ucs._1_1_ = in_stack_fffffffffffffe5f;
    ch_09.ucs._0_1_ = in_stack_fffffffffffffe5e;
    ungetChar(in_stack_fffffffffffffe50,ch_09);
LAB_004a9855:
    if (lVar9 == 0) {
      local_fc = npsMissingDigit;
      goto LAB_004a9b11;
    }
    QLocale::negativeSign
              ((QLocale *)
               CONCAT17(in_stack_fffffffffffffe5f,
                        CONCAT16(in_stack_fffffffffffffe5e,
                                 CONCAT15(in_stack_fffffffffffffe5d,
                                          CONCAT14(in_stack_fffffffffffffe5c,
                                                   in_stack_fffffffffffffe58)))));
    bVar3 = ::operator==((QChar *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    QString::~QString((QString *)0x4a98ac);
    if ((bVar3 & 1) != 0) {
      local_168 = local_130;
      if (0 < local_130) {
        local_168 = -local_130;
      }
      local_130 = local_168;
    }
    break;
  case 0x10:
    local_ea[0].ucs = L'ꪪ';
    QChar::QChar(local_ea);
    local_ec.ucs = L'ꪪ';
    QChar::QChar(&local_ec);
    local_ee.ucs = L'ꪪ';
    QChar::QChar(&local_ee);
    bVar1 = getChar(in_stack_fffffffffffffe60,
                    (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               CONCAT15(in_stack_fffffffffffffe5d,
                                                        CONCAT14(in_stack_fffffffffffffe5c,
                                                                 in_stack_fffffffffffffe58)))));
    uVar8 = true;
    if (bVar1) {
      QChar::QChar<char16_t,_true>(&local_f0,L'0');
      uVar8 = ::operator!=((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48);
    }
    if ((bool)uVar8 != false) {
      local_fc = npsInvalidPrefix;
      goto LAB_004a9b11;
    }
    bVar1 = getChar(in_stack_fffffffffffffe60,
                    (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                      CONCAT16(in_stack_fffffffffffffe5e,
                                               (uint6)CONCAT14(in_stack_fffffffffffffe5c,
                                                               in_stack_fffffffffffffe58))));
    bVar2 = true;
    if (bVar1) {
      local_f2 = (char16_t)QChar::toLower((QChar *)in_stack_fffffffffffffe50);
      QChar::QChar<char16_t,_true>(&local_f4,L'x');
      bVar2 = ::operator!=((QChar *)in_stack_fffffffffffffe50,(QChar *)in_stack_fffffffffffffe48);
    }
    if (bVar2 != false) {
      local_fc = npsInvalidPrefix;
      goto LAB_004a9b11;
    }
    local_170 = 0;
    uVar7 = 0;
    while (bVar1 = getChar(in_stack_fffffffffffffe60,
                           (QChar *)CONCAT17(in_stack_fffffffffffffe5f,
                                             CONCAT16(in_stack_fffffffffffffe5e,
                                                      CONCAT15(uVar8,CONCAT14(uVar7,
                                                  in_stack_fffffffffffffe58))))), bVar1) {
      pcVar5 = QChar::unicode(&local_ee);
      iVar4 = QtMiscUtils::fromHex((uint)(ushort)*pcVar5);
      if (iVar4 == -1) {
        ch_10.ucs._1_1_ = in_stack_fffffffffffffe5f;
        ch_10.ucs._0_1_ = in_stack_fffffffffffffe5e;
        ungetChar(in_stack_fffffffffffffe50,ch_10);
        break;
      }
      local_130 = (long)iVar4 + local_130 * 0x10;
      local_170 = local_170 + 1;
    }
    if (local_170 == 0) {
      local_fc = npsMissingDigit;
      goto LAB_004a9b11;
    }
  }
  if (in_RSI != (long *)0x0) {
    *in_RSI = local_130;
  }
  local_fc = npsOk;
LAB_004a9b11:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_fc;
}

Assistant:

QTextStreamPrivate::NumberParsingStatus QTextStreamPrivate::getNumber(qulonglong *ret)
{
    scan(nullptr, nullptr, 0, NotSpace);
    consumeLastToken();

    // detect integer encoding
    int base = params.integerBase;
    if (base == 0) {
        QChar ch;
        if (!getChar(&ch))
            return npsInvalidPrefix;
        if (ch == u'0') {
            QChar ch2;
            if (!getChar(&ch2)) {
                // Result is the number 0
                *ret = 0;
                return npsOk;
            }
            ch2 = ch2.toLower();

            if (ch2 == u'x') {
                base = 16;
            } else if (ch2 == u'b') {
                base = 2;
            } else if (ch2.isDigit() && ch2.digitValue() >= 0 && ch2.digitValue() <= 7) {
                base = 8;
            } else {
                base = 10;
            }
            ungetChar(ch2);
        } else if (ch == locale.negativeSign() || ch == locale.positiveSign() || ch.isDigit()) {
            base = 10;
        } else {
            ungetChar(ch);
            return npsInvalidPrefix;
        }
        ungetChar(ch);
        // State of the stream is now the same as on entry
        // (cursor is at prefix),
        // and local variable 'base' has been set appropriately.
    }

    qulonglong val=0;
    switch (base) {
    case 2: {
        QChar pf1, pf2, dig;
        // Parse prefix '0b'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'b')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (n == u'0' || n == u'1') {
                val <<= 1;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf2);
            ungetChar(pf1);
            return npsMissingDigit;
        }
        break;
    }
    case 8: {
        QChar pf, dig;
        // Parse prefix u'0'
        if (!getChar(&pf) || pf != u'0')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            char16_t n = dig.toLower().unicode();
            if (isOctalDigit(n)) {
                val *= 8;
                val += n - u'0';
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            // Unwind the prefix and abort
            ungetChar(pf);
            return npsMissingDigit;
        }
        break;
    }
    case 10: {
        // Parse sign (or first digit)
        QChar sign;
        qsizetype ndigits = 0;
        if (!getChar(&sign))
            return npsMissingDigit;
        if (sign != locale.negativeSign() && sign != locale.positiveSign()) {
            if (!sign.isDigit()) {
                ungetChar(sign);
                return npsMissingDigit;
            }
            val += sign.digitValue();
            ndigits++;
        }
        // Parse digits
        QChar ch;
        while (getChar(&ch)) {
            if (ch.isDigit()) {
                val *= 10;
                val += ch.digitValue();
            } else if (locale != QLocale::c() && ch == locale.groupSeparator()) {
                continue;
            } else {
                ungetChar(ch);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0)
            return npsMissingDigit;
        if (sign == locale.negativeSign()) {
            qlonglong ival = qlonglong(val);
            if (ival > 0)
                ival = -ival;
            val = qulonglong(ival);
        }
        break;
    }
    case 16: {
        QChar pf1, pf2, dig;
        // Parse prefix ' 0x'
        if (!getChar(&pf1) || pf1 != u'0')
            return npsInvalidPrefix;
        if (!getChar(&pf2) || pf2.toLower() != u'x')
            return npsInvalidPrefix;
        // Parse digits
        qsizetype ndigits = 0;
        while (getChar(&dig)) {
            const int h = fromHex(dig.unicode());
            if (h != -1) {
                val <<= 4;
                val += h;
            } else {
                ungetChar(dig);
                break;
            }
            ndigits++;
        }
        if (ndigits == 0) {
            return npsMissingDigit;
        }
        break;
    }
    default:
        // Unsupported integerBase
        return npsInvalidPrefix;
    }

    if (ret)
        *ret = val;
    return npsOk;
}